

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtcnn.cpp
# Opt level: O1

void __thiscall Pnet::~Pnet(Pnet *this)

{
  pointer poVar1;
  pointer pBVar2;
  
  freepBox(this->rgb);
  freepBox(this->conv1);
  freepBox(this->maxPooling1);
  freepBox(this->conv2);
  freepBox(this->conv3);
  freepBox(this->score_);
  freepBox(this->location_);
  freeWeight(this->conv1_wb);
  freepRelu(this->prelu_gmma1);
  freeWeight(this->conv2_wb);
  freepRelu(this->prelu_gmma2);
  freeWeight(this->conv3_wb);
  freepRelu(this->prelu_gmma3);
  freeWeight(this->conv4c1_wb);
  freeWeight(this->conv4c2_wb);
  poVar1 = (this->bboxScore_).super__Vector_base<orderScore,_std::allocator<orderScore>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (poVar1 != (pointer)0x0) {
    operator_delete(poVar1,(long)(this->bboxScore_).
                                 super__Vector_base<orderScore,_std::allocator<orderScore>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)poVar1);
  }
  pBVar2 = (this->boundingBox_).super__Vector_base<Bbox,_std::allocator<Bbox>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pBVar2 != (pointer)0x0) {
    operator_delete(pBVar2,(long)(this->boundingBox_).
                                 super__Vector_base<Bbox,_std::allocator<Bbox>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pBVar2);
    return;
  }
  return;
}

Assistant:

Pnet::~Pnet() {
    freepBox(this->rgb);
    freepBox(this->conv1);
    freepBox(this->maxPooling1);
    freepBox(this->conv2);
    freepBox(this->conv3);
    freepBox(this->score_);
    freepBox(this->location_);

    freeWeight(this->conv1_wb);
    freepRelu(this->prelu_gmma1);
    freeWeight(this->conv2_wb);
    freepRelu(this->prelu_gmma2);
    freeWeight(this->conv3_wb);
    freepRelu(this->prelu_gmma3);
    freeWeight(this->conv4c1_wb);
    freeWeight(this->conv4c2_wb);
}